

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

void __thiscall
MemoryLeakDetector::checkForCorruption
          (MemoryLeakDetector *this,MemoryLeakDetectorNode *node,char *file,size_t line,
          TestMemoryAllocator *allocator,bool allocateNodesSeperately)

{
  bool bVar1;
  int iVar2;
  MemoryLeakDetector *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  MemoryLeakDetector *this_00;
  MemoryLeakDetector *pMVar4;
  
  pMVar3 = (MemoryLeakDetector *)(**(code **)(**(long **)(node + 0x28) + 0x50))();
  this_00 = (MemoryLeakDetector *)allocator;
  iVar2 = (*allocator->_vptr_TestMemoryAllocator[10])();
  pMVar4 = (MemoryLeakDetector *)CONCAT44(extraout_var,iVar2);
  if ((pMVar3 != pMVar4) && (this->doAllocationTypeChecking_ == true)) {
    iVar2 = (*pMVar4->_vptr_MemoryLeakDetector[7])(pMVar4,pMVar3);
    this_00 = pMVar4;
    if ((char)iVar2 == '\0') {
      iVar2 = (*allocator->_vptr_TestMemoryAllocator[10])(allocator);
      MemoryLeakOutputStringBuffer::reportAllocationDeallocationMismatchFailure
                (&this->outputBuffer_,node,file,line,
                 (TestMemoryAllocator *)CONCAT44(extraout_var_01,iVar2),this->reporter_);
      return;
    }
  }
  bVar1 = validMemoryCorruptionInformation(this_00,(char *)(*(long *)(node + 0x10) + *(long *)node))
  ;
  if (bVar1) {
    if (allocateNodesSeperately) {
      (*allocator->_vptr_TestMemoryAllocator[9])(allocator,node);
      return;
    }
    return;
  }
  iVar2 = (*allocator->_vptr_TestMemoryAllocator[10])(allocator);
  MemoryLeakOutputStringBuffer::reportMemoryCorruptionFailure
            (&this->outputBuffer_,node,file,line,
             (TestMemoryAllocator *)CONCAT44(extraout_var_00,iVar2),this->reporter_);
  return;
}

Assistant:

void MemoryLeakDetector::checkForCorruption(MemoryLeakDetectorNode* node, const char* file, size_t line, TestMemoryAllocator* allocator, bool allocateNodesSeperately)
{
    if (!matchingAllocation(node->allocator_->actualAllocator(), allocator->actualAllocator()))
        outputBuffer_.reportAllocationDeallocationMismatchFailure(node, file, line, allocator->actualAllocator(), reporter_);
    else if (!validMemoryCorruptionInformation(node->memory_ + node->size_))
        outputBuffer_.reportMemoryCorruptionFailure(node, file, line, allocator->actualAllocator(), reporter_);
    else if (allocateNodesSeperately)
        allocator->freeMemoryLeakNode((char*) node);
}